

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

int diy::io::utils::close(int __fd)

{
  int in_EAX;
  
  fsync(__fd);
  ::close(__fd);
  return in_EAX;
}

Assistant:

inline void close(int fd)
  {
#if defined(_WIN32)
    _close(fd);
#else
    fsync(fd);
    ::close(fd);
#endif
  }